

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

void __thiscall QToolBarAreaLayout::apply(QToolBarAreaLayout *this,bool animate)

{
  Representation RVar1;
  int iVar2;
  QToolBarAreaLayoutItem *pQVar3;
  long *plVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  QRect QVar7;
  QRect QVar8;
  undefined4 uVar9;
  Representation RVar10;
  bool bVar11;
  char cVar12;
  LayoutDirection direction;
  Representation RVar13;
  QMainWindowLayout *pQVar14;
  QWidget *widget;
  QWidget *this_00;
  QToolBarLayout *this_01;
  QSize QVar15;
  ulong uVar16;
  long lVar17;
  QToolBarAreaLayoutLine *this_02;
  Representation RVar18;
  ulong uVar19;
  long lVar20;
  long in_FS_OFFSET;
  QSize local_50;
  undefined1 local_48 [8];
  Representation RStack_40;
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar14 = qt_mainwindow_layout(this->mainWindow);
  direction = QWidget::layoutDirection(&this->mainWindow->super_QWidget);
  lVar17 = 0;
  do {
    if (this->docks[lVar17].lines.d.size != 0) {
      uVar16 = 0;
      do {
        this_02 = this->docks[lVar17].lines.d.ptr + uVar16;
        bVar11 = QToolBarAreaLayoutLine::skip(this_02);
        if ((!bVar11) && ((this_02->toolBarItems).d.size != 0)) {
          lVar20 = 0x14;
          uVar19 = 0;
          do {
            pQVar3 = (this_02->toolBarItems).d.ptr;
            if (*(char *)((long)&pQVar3->widgetItem + lVar20) == '\0') {
              plVar4 = *(long **)((long)pQVar3 + lVar20 + -0x14);
              if (plVar4 != (long *)0x0) {
                cVar12 = (**(code **)(*plVar4 + 0x40))();
                if (cVar12 == '\0') goto LAB_004b9467;
              }
            }
            else {
LAB_004b9467:
              if (*(char *)((long)&pQVar3->widgetItem + lVar20) == '\0') {
                _local_48 = ZEXT412(0xffffffff) << 0x40;
                RStack_3c.m_i = -1;
                if (this->visible == true) {
                  if (this_02->o == Horizontal) {
                    auVar5._4_4_ = RStack_40.m_i;
                    auVar5._8_4_ = RStack_3c.m_i;
                    auVar5._0_4_ = (this_02->rect).y1.m_i;
                    _local_48 = auVar5 << 0x20;
                    RVar1.m_i = (this_02->rect).y2.m_i;
                    RStack_3c.m_i = RVar1.m_i;
                    iVar2 = *(int *)((long)pQVar3 + lVar20 + -0xc);
                    local_48._0_4_ = (this_02->rect).x1.m_i + iVar2;
                    RStack_40.m_i =
                         iVar2 + (this_02->rect).x1.m_i + *(int *)((long)pQVar3 + lVar20 + -8) + -1;
                  }
                  else {
                    RVar1.m_i = (this_02->rect).x1.m_i;
                    local_48._0_4_ = RVar1.m_i;
                    RStack_40.m_i = (this_02->rect).x2.m_i;
                    RStack_3c.m_i = -1;
                    iVar2 = *(int *)((long)pQVar3 + lVar20 + -0xc);
                    local_48._4_4_ = (this_02->rect).y1.m_i + iVar2;
                    RStack_3c.m_i =
                         iVar2 + (this_02->rect).y1.m_i + *(int *)((long)pQVar3 + lVar20 + -8) + -1;
                  }
                }
                widget = (QWidget *)
                         (**(code **)(**(long **)((long)pQVar3 + lVar20 + -0x14) + 0x68))();
                this_00 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
                if (this_00 != (QWidget *)0x0) {
                  QWidget::layout(this_00);
                  this_01 = (QToolBarLayout *)
                            QMetaObject::cast((QObject *)&QToolBarLayout::staticMetaObject);
                  if ((this_01->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
                    RVar10.m_i = RStack_40.m_i;
                    uVar9 = local_48._4_4_;
                    local_50.wd.m_i = (RStack_40.m_i - local_48._0_4_) + 1;
                    local_50.ht.m_i = (RStack_3c.m_i - local_48._4_4_) + 1;
                    QVar15 = QToolBarLayout::expandedSize(this_01,&local_50);
                    RVar13.m_i = (RVar10.m_i - QVar15.wd.m_i) + 1;
                    local_48._0_4_ = RVar13.m_i;
                    _local_48 = CONCAT48(RVar10.m_i,local_48);
                    RVar18.m_i = QVar15.ht.m_i.m_i + -1 + uVar9;
                    RStack_3c.m_i = RVar18.m_i;
                    local_48 = (undefined1  [8])CONCAT44(uVar9,local_48._0_4_);
                    RVar1.m_i = (this->rect).y2.m_i;
                    if (RVar1.m_i < RVar18.m_i) {
                      local_48._4_4_ = (RVar1.m_i - QVar15.ht.m_i) + 1;
                      RStack_3c.m_i = RVar1.m_i;
                    }
                    QVar7 = _local_48;
                    iVar2 = (this->rect).x2.m_i;
                    if (iVar2 < RVar10.m_i) {
                      local_48._0_4_ = (RVar13.m_i - RVar10.m_i) + iVar2;
                      QVar8 = _local_48;
                      RStack_3c = QVar7.y2.m_i;
                      local_48 = QVar8._0_8_;
                      RStack_40.m_i = iVar2;
                    }
                    if ((int)local_48._0_4_ < 0) {
                      iVar2 = RStack_40.m_i - local_48._0_4_;
                      RStack_40.m_i = iVar2;
                      auVar6._12_4_ = 0;
                      auVar6._0_12_ = stack0xffffffffffffffbc;
                      _local_48 = (QRect)(auVar6 << 0x20);
                    }
                    QVar7 = _local_48;
                    if ((int)local_48._4_4_ < 0) {
                      RVar1.m_i = RStack_3c.m_i - local_48._4_4_;
                      RStack_3c.m_i = RVar1.m_i;
                      local_48._0_4_ = QVar7.x1.m_i;
                      local_48._4_4_ = 0;
                    }
                  }
                }
                if ((this->visible == true) && (this->docks[lVar17].o == Horizontal)) {
                  _local_48 = QStyle::visualRect(direction,&this_02->rect,(QRect *)local_48);
                }
                QWidgetAnimator::animate
                          ((QWidgetAnimator *)&pQVar14->widgetAnimator,widget,(QRect *)local_48,
                           animate);
              }
            }
            uVar19 = uVar19 + 1;
            lVar20 = lVar20 + 0x18;
          } while (uVar19 < (ulong)(this_02->toolBarItems).d.size);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < (ulong)this->docks[lVar17].lines.d.size);
    }
    lVar17 = lVar17 + 1;
    if (lVar17 == 4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void QToolBarAreaLayout::apply(bool animate)
{
    QMainWindowLayout *layout = qt_mainwindow_layout(mainWindow);
    Q_ASSERT(layout != nullptr);

    Qt::LayoutDirection dir = mainWindow->layoutDirection();

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);
            if (line.skip())
                continue;

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                const QToolBarAreaLayoutItem &item = line.toolBarItems.at(k);
                if (item.skip() || item.gap)
                    continue;

                QRect geo;
                if (visible) {
                    if (line.o == Qt::Horizontal) {
                        geo.setTop(line.rect.top());
                        geo.setBottom(line.rect.bottom());
                        geo.setLeft(line.rect.left() + item.pos);
                        geo.setRight(line.rect.left() + item.pos + item.size - 1);
                    } else {
                        geo.setLeft(line.rect.left());
                        geo.setRight(line.rect.right());
                        geo.setTop(line.rect.top() + item.pos);
                        geo.setBottom(line.rect.top() + item.pos + item.size - 1);
                    }
                }

                QWidget *widget = item.widgetItem->widget();
                if (QToolBar *toolBar = qobject_cast<QToolBar*>(widget)) {
                    QToolBarLayout *tbl = qobject_cast<QToolBarLayout*>(toolBar->layout());
                    if (tbl->expanded) {
                        QPoint tr = geo.topRight();
                        QSize size = tbl->expandedSize(geo.size());
                        geo.setSize(size);
                        geo.moveTopRight(tr);
                        if (geo.bottom() > rect.bottom())
                            geo.moveBottom(rect.bottom());
                        if (geo.right() > rect.right())
                            geo.moveRight(rect.right());
                        if (geo.left() < 0)
                            geo.moveLeft(0);
                        if (geo.top() < 0)
                            geo.moveTop(0);
                    }
                }

                if (visible && dock.o == Qt::Horizontal)
                    geo = QStyle::visualRect(dir, line.rect, geo);

                layout->widgetAnimator.animate(widget, geo, animate);
            }
        }
    }
}